

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

int __thiscall spectest::ReadAndRunSpecJSON(spectest *this,string_view spec_json_filename)

{
  string_view spec_json_filename_00;
  Enum EVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Result local_28c;
  int failed;
  CommandRunner runner;
  undefined1 local_e0 [8];
  Script script;
  Result local_8c;
  undefined1 local_88 [8];
  JSONParser parser;
  string_view spec_json_filename_local;
  
  parser._96_8_ = this;
  JSONParser::JSONParser((JSONParser *)local_88);
  spec_json_filename_00.size_ = (size_type)spec_json_filename.data_;
  spec_json_filename_00.data_ = (char *)parser._96_8_;
  local_8c = JSONParser::ReadFile((JSONParser *)local_88,spec_json_filename_00);
  EVar1 = wabt::Result::operator_cast_to_Enum(&local_8c);
  if (EVar1 == Error) {
    spec_json_filename_local.size_._4_4_ = 1;
    script.commands.
    super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    Script::Script((Script *)local_e0);
    runner.source_filename_.field_2._12_4_ =
         JSONParser::ParseScript((JSONParser *)local_88,(Script *)local_e0);
    EVar1 = wabt::Result::operator_cast_to_Enum
                      ((Result *)((long)&runner.source_filename_.field_2 + 0xc));
    if (EVar1 == Error) {
      spec_json_filename_local.size_._4_4_ = 1;
      script.commands.
      super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      CommandRunner::CommandRunner((CommandRunner *)&failed);
      local_28c = CommandRunner::Run((CommandRunner *)&failed,(Script *)local_e0);
      EVar1 = wabt::Result::operator_cast_to_Enum(&local_28c);
      if (EVar1 == Error) {
        spec_json_filename_local.size_._4_4_ = 1;
      }
      else {
        uVar2 = CommandRunner::passed((CommandRunner *)&failed);
        uVar3 = CommandRunner::total((CommandRunner *)&failed);
        printf("%d/%d tests passed.\n",(ulong)uVar2,(ulong)uVar3);
        iVar4 = CommandRunner::total((CommandRunner *)&failed);
        iVar5 = CommandRunner::passed((CommandRunner *)&failed);
        spec_json_filename_local.size_._4_4_ = iVar4 - iVar5;
      }
      script.commands.
      super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      CommandRunner::~CommandRunner((CommandRunner *)&failed);
    }
    Script::~Script((Script *)local_e0);
  }
  JSONParser::~JSONParser((JSONParser *)local_88);
  return spec_json_filename_local.size_._4_4_;
}

Assistant:

static int ReadAndRunSpecJSON(string_view spec_json_filename) {
  JSONParser parser;
  if (parser.ReadFile(spec_json_filename) == wabt::Result::Error) {
    return 1;
  }

  Script script;
  if (parser.ParseScript(&script) == wabt::Result::Error) {
    return 1;
  }

  CommandRunner runner;
  if (runner.Run(script) == wabt::Result::Error) {
    return 1;
  }

  printf("%d/%d tests passed.\n", runner.passed(), runner.total());
  const int failed = runner.total() - runner.passed();
  return failed;
}